

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr_ptr.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4ba8::QSBRPtr_LessThan_Test::TestBody(QSBRPtr_LessThan_Test *this)

{
  char *in_R9;
  pointer *__ptr;
  string local_58;
  internal local_38 [8];
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  unodb::detail::qsbr_ptr_base::register_active_ptr(&(anonymous_namespace)::two_chars);
  unodb::detail::qsbr_ptr_base::register_active_ptr
            ((void *)((long)&(anonymous_namespace)::two_chars + 1));
  unodb::detail::qsbr_ptr_base::register_active_ptr(&(anonymous_namespace)::two_chars);
  local_38[0] = (internal)0x1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  unodb::detail::qsbr_ptr_base::unregister_active_ptr(&(anonymous_namespace)::two_chars);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_38,(AssertionResult *)"ptr1 < ptr1","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_qsbr_ptr.cpp"
               ,0x15d,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_20);
  }
  else {
    if (gtest_ar_._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar_._0_8_);
    }
    unodb::detail::qsbr_ptr_base::register_active_ptr
              ((void *)((long)&(anonymous_namespace)::two_chars + 1));
    local_38[0] = (internal)0x1;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    unodb::detail::qsbr_ptr_base::unregister_active_ptr
              ((void *)((long)&(anonymous_namespace)::two_chars + 1));
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_20);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,local_38,(AssertionResult *)"ptr1 < ptr2","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_qsbr_ptr.cpp"
                 ,0x15e,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_20);
    }
    else {
      if (gtest_ar_._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_._0_8_);
      }
      unodb::detail::qsbr_ptr_base::register_active_ptr(&(anonymous_namespace)::two_chars);
      local_38[0] = (internal)0x1;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      unodb::detail::qsbr_ptr_base::unregister_active_ptr(&(anonymous_namespace)::two_chars);
      if (local_38[0] != (internal)0x0) goto LAB_001161ce;
      testing::Message::Message((Message *)&local_20);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,local_38,(AssertionResult *)"ptr2 < ptr1","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_qsbr_ptr.cpp"
                 ,0x15f,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_20);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
LAB_001161ce:
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  unodb::detail::qsbr_ptr_base::unregister_active_ptr
            ((void *)((long)&(anonymous_namespace)::two_chars + 1));
  unodb::detail::qsbr_ptr_base::unregister_active_ptr(&(anonymous_namespace)::two_chars);
  return;
}

Assistant:

UNODB_TEST(QSBRPtr, LessThan) {
  // NOLINTNEXTLINE(readability-container-data-pointer)
  const unodb::qsbr_ptr<const char> ptr1{&two_chars[0]};
  const unodb::qsbr_ptr<const char> ptr2{&two_chars[1]};

  UNODB_ASSERT_FALSE(ptr1 < ptr1);
  UNODB_ASSERT_TRUE(ptr1 < ptr2);
  UNODB_ASSERT_FALSE(ptr2 < ptr1);
}